

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_90;
  StringTree *local_78;
  StringTree *local_70;
  StringTree *local_68;
  ArrayPtr<const_char> *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  size_t sStack_40;
  size_t local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_58 = (this->text).content.ptr;
  local_50 = params->ptr;
  local_48 = (params_1->text).content.ptr;
  sStack_40 = params_2->size_;
  local_38 = params_3->size_;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x5;
  local_70 = (StringTree *)params;
  sVar1 = _::sum((_ *)&local_58,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_58 = (this->text).content.ptr;
  local_50 = (char *)0x0;
  local_48 = (params_1->text).content.ptr;
  sStack_40 = params_2->size_;
  local_38 = params_3->size_;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x5;
  local_78 = this;
  local_68 = params_1;
  local_60 = params_2;
  sVar1 = _::sum((_ *)&local_58,nums_00);
  heapString((String *)&local_90,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_90);
  Array<char>::~Array((Array<char> *)&local_90);
  local_58 = (char *)0x0;
  local_50 = (char *)0x1;
  local_48 = (char *)0x0;
  sStack_40 = 0;
  local_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x5;
  sVar1 = _::sum((_ *)&local_58,nums_01);
  local_90.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_90.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_90.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_90);
  Array<kj::StringTree::Branch>::~Array(&local_90);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_78,local_70,
             (ArrayPtr<const_char> *)local_68,local_60,params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}